

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

int Mio_LibGateSimulateOne(Mio_Gate_t *pGate,int *iBits)

{
  int iVar1;
  word *p;
  uint local_24;
  int local_20;
  int iMint;
  int i;
  int nVars;
  int *iBits_local;
  Mio_Gate_t *pGate_local;
  
  iVar1 = Mio_GateReadPinNum(pGate);
  local_24 = 0;
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    if (iBits[local_20] != 0) {
      local_24 = 1 << ((byte)local_20 & 0x1f) | local_24;
    }
  }
  p = Mio_GateReadTruthP(pGate);
  iVar1 = Abc_InfoHasBit((uint *)p,local_24);
  return iVar1;
}

Assistant:

int Mio_LibGateSimulateOne( Mio_Gate_t * pGate, int iBits[6] )
{
    int nVars = Mio_GateReadPinNum(pGate);
    int i, iMint = 0;
    for ( i = 0; i < nVars; i++ )
        if ( iBits[i] )
            iMint |= (1 << i);
    return Abc_InfoHasBit( (unsigned *)Mio_GateReadTruthP(pGate), iMint );
}